

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Type.cpp
# Opt level: O0

Type * __thiscall soul::Type::removeConstIfPresent(Type *__return_storage_ptr__,Type *this)

{
  Type *this_local;
  Type *t;
  
  Type(__return_storage_ptr__,this);
  __return_storage_ptr__->isConstant = false;
  return __return_storage_ptr__;
}

Assistant:

Type Type::removeConstIfPresent() const      { auto t = *this; t.isConstant = false; return t; }